

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_on_goaway_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_on_frame_recv_callback p_Var1;
  int iVar2;
  char *reason;
  int32_t last_stream_id;
  
  if ((frame->hd).stream_id == 0) {
    iVar2 = (frame->priority).pri_spec.stream_id;
    if (((iVar2 < 1) || (((session->server == '\0' ^ (byte)iVar2) & 1) == 0)) &&
       (iVar2 <= session->remote_last_stream_id)) {
      session->goaway_flags = session->goaway_flags | 8;
      last_stream_id = (frame->priority).pri_spec.stream_id;
      session->remote_last_stream_id = last_stream_id;
      p_Var1 = (session->callbacks).on_frame_recv_callback;
      if (p_Var1 != (nghttp2_on_frame_recv_callback)0x0) {
        iVar2 = (*p_Var1)(session,frame,session->user_data);
        if (iVar2 != 0) {
          return -0x386;
        }
        last_stream_id = (frame->priority).pri_spec.stream_id;
      }
      iVar2 = session_close_stream_on_goaway(session,last_stream_id,0);
      return iVar2;
    }
    reason = "GOAWAY: invalid last_stream_id";
  }
  else {
    reason = "GOAWAY: stream_id != 0";
  }
  iVar2 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
  return iVar2;
}

Assistant:

int nghttp2_session_on_goaway_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  int rv;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: stream_id != 0");
  }
  /* Spec says Endpoints MUST NOT increase the value they send in the
     last stream identifier. */
  if ((frame->goaway.last_stream_id > 0 &&
       !nghttp2_session_is_my_stream_id(session,
                                        frame->goaway.last_stream_id)) ||
      session->remote_last_stream_id < frame->goaway.last_stream_id) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: invalid last_stream_id");
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_RECV;

  session->remote_last_stream_id = frame->goaway.last_stream_id;

  rv = session_call_on_frame_received(session, frame);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                        0);
}